

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators.hpp
# Opt level: O2

Result * CoreML::validateFeatureDescriptions<CoreML::Specification::FunctionDescription>
                   (Result *__return_storage_ptr__,FunctionDescription *interface,int modelVersion,
                   ValidationPolicy *validationPolicy)

{
  int iVar1;
  Rep *pRVar2;
  bool bVar3;
  string *psVar4;
  long lVar5;
  void **ppvVar6;
  long lVar7;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  lVar5 = (long)(interface->input_).super_RepeatedPtrFieldBase.current_size_;
  if (lVar5 < 1) {
    if (validationPolicy->allowsEmptyInput != false) {
      if (modelVersion < 9) {
        std::__cxx11::to_string(&local_50,9);
        std::operator+(&local_70,"Empty input is only valid in specification verison >= ",&local_50)
        ;
        std::operator+(&local_b0,&local_70,". This model has version ");
        std::__cxx11::to_string(&local_90,modelVersion);
        std::operator+(&local_d0,&local_b0,&local_90);
        Result::Result(__return_storage_ptr__,INVALID_COMPATIBILITY_VERSION,&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_70);
        psVar4 = &local_50;
        goto LAB_0026c47c;
      }
      goto LAB_0026c317;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"Models must have one or more inputs.",
               (allocator<char> *)&local_b0);
    Result::Result(__return_storage_ptr__,MODEL_TYPE_DOES_NOT_SUPPORT_EMPTY_INPUT,&local_d0);
  }
  else {
LAB_0026c317:
    if ((validationPolicy->allowsEmptyOutput != false) ||
       (0 < (interface->output_).super_RepeatedPtrFieldBase.current_size_)) {
      pRVar2 = (interface->input_).super_RepeatedPtrFieldBase.rep_;
      ppvVar6 = pRVar2->elements;
      if (pRVar2 == (Rep *)0x0) {
        ppvVar6 = (void **)0x0;
      }
      psVar4 = &__return_storage_ptr__->m_message;
      for (lVar7 = 0; lVar5 * 8 != lVar7; lVar7 = lVar7 + 8) {
        validateFeatureDescription
                  (__return_storage_ptr__,*(FeatureDescription **)((long)ppvVar6 + lVar7),
                   modelVersion,INPUT);
        bVar3 = Result::good(__return_storage_ptr__);
        if (!bVar3) {
          return __return_storage_ptr__;
        }
        std::__cxx11::string::~string((string *)psVar4);
      }
      pRVar2 = (interface->output_).super_RepeatedPtrFieldBase.rep_;
      ppvVar6 = pRVar2->elements;
      if (pRVar2 == (Rep *)0x0) {
        ppvVar6 = (void **)0x0;
      }
      iVar1 = (interface->output_).super_RepeatedPtrFieldBase.current_size_;
      for (lVar5 = 0; (long)iVar1 * 8 != lVar5; lVar5 = lVar5 + 8) {
        validateFeatureDescription
                  (__return_storage_ptr__,*(FeatureDescription **)((long)ppvVar6 + lVar5),
                   modelVersion,OUTPUT);
        bVar3 = Result::good(__return_storage_ptr__);
        if (!bVar3) {
          return __return_storage_ptr__;
        }
        std::__cxx11::string::~string((string *)psVar4);
      }
      pRVar2 = (interface->state_).super_RepeatedPtrFieldBase.rep_;
      ppvVar6 = pRVar2->elements;
      if (pRVar2 == (Rep *)0x0) {
        ppvVar6 = (void **)0x0;
      }
      iVar1 = (interface->state_).super_RepeatedPtrFieldBase.current_size_;
      lVar5 = 0;
      while( true ) {
        if ((long)iVar1 * 8 == lVar5) {
          Result::Result(__return_storage_ptr__);
          return __return_storage_ptr__;
        }
        validateFeatureDescription
                  (__return_storage_ptr__,*(FeatureDescription **)((long)ppvVar6 + lVar5),
                   modelVersion,STATE);
        bVar3 = Result::good(__return_storage_ptr__);
        if (!bVar3) break;
        std::__cxx11::string::~string((string *)psVar4);
        lVar5 = lVar5 + 8;
      }
      return __return_storage_ptr__;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"Models must have one or more outputs.",
               (allocator<char> *)&local_b0);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_d0);
  }
  psVar4 = &local_d0;
LAB_0026c47c:
  std::__cxx11::string::~string((string *)psVar4);
  return __return_storage_ptr__;
}

Assistant:

inline Result validateFeatureDescriptions(const Description& interface, int modelVersion, const ValidationPolicy& validationPolicy) {
        if (interface.input_size() < 1) {
            if (!validationPolicy.allowsEmptyInput) {
                return Result(ResultType::MODEL_TYPE_DOES_NOT_SUPPORT_EMPTY_INPUT, "Models must have one or more inputs.");
            }

            if (modelVersion < MLMODEL_SPECIFICATION_VERSION_IOS18) {
                return  Result(ResultType::INVALID_COMPATIBILITY_VERSION,
                               "Empty input is only valid in specification verison >= " + std::to_string(MLMODEL_SPECIFICATION_VERSION_IOS18)+
                               ". This model has version " + std::to_string(modelVersion));
            }
        }

        if (!validationPolicy.allowsEmptyOutput && interface.output_size() < 1) {
            return Result(ResultType::INVALID_MODEL_INTERFACE, "Models must have one or more outputs.");
        }

        for (const auto& input : interface.input()) {
            Result r = validateFeatureDescription(input, modelVersion, FeatureIOType::INPUT);
            if (!r.good()) { return r; }
        }

        for (const auto& output : interface.output()) {
            Result r = validateFeatureDescription(output, modelVersion, FeatureIOType::OUTPUT);
            if (!r.good()) { return r; }
        }

        for (const auto& state : interface.state()) {
            Result r = validateFeatureDescription(state, modelVersion, FeatureIOType::STATE);
            if (!r.good()) { return r; }
        }

        // If we got here, all inputs/outputs seem good independently of each other.
        return Result();
    }